

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O3

Polynomial * getCharacteristicPolynomial(RationalNum **matrix,uint size)

{
  double dVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  Polynomial *pPVar4;
  RationalNum *pRVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  double local_70;
  Polynomial *local_68;
  double local_60;
  undefined1 local_58 [16];
  ulong local_48;
  double local_40;
  RationalNum **local_38;
  
  if (matrix == (RationalNum **)0x0) {
    local_68 = (Polynomial *)0x0;
  }
  else {
    uVar2 = (ulong)size;
    local_38 = matrix;
    pPVar4 = (Polynomial *)operator_new(0x10);
    pPVar4->degree = size;
    uVar9 = (ulong)(size + 1) << 4;
    pRVar5 = (RationalNum *)operator_new__(uVar9);
    if (size != 0xffffffff) {
      uVar7 = 0;
      do {
        RationalNum::RationalNum((RationalNum *)((long)&pRVar5->numerator + uVar7));
        uVar7 = uVar7 + 0x10;
      } while (uVar9 != uVar7);
    }
    pPVar4->coefficients = pRVar5;
    local_40 = (double)uVar2;
    local_68 = pPVar4;
    local_48 = uVar2;
    dVar1 = exp2(local_40);
    if (0.0 < dVar1) {
      local_60 = (double)(size + 1);
      uVar8 = 0;
      do {
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        auVar3._12_4_ = 0;
        auVar3._0_12_ = local_58._4_12_;
        local_58 = auVar3 << 0x20;
        dVar1 = exp2(local_60);
        if (1.0 < dVar1) {
          uVar6 = 1;
          do {
            if ((uVar6 & uVar8) != 0) {
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                           (iterator)
                           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)local_58);
              }
              else {
                *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_58._0_4_;
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            local_58._0_4_ = local_58._0_4_ + 1;
            uVar6 = uVar6 * 2;
            local_70 = (double)uVar6;
            dVar1 = exp2(local_60);
          } while (local_70 < dVar1);
        }
        local_58 = (undefined1  [16])getMainMinor(local_38,&local_88);
        RationalNum::operator+=
                  (pRVar5 + (uVar2 - ((ulong)((long)local_88.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_88.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2)),
                   (RationalNum *)local_58);
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar8 = uVar8 + 1;
        local_70 = (double)uVar8;
        dVar1 = exp2(local_40);
      } while (local_70 < dVar1);
    }
    uVar8 = (uint)local_48;
    if (uVar8 != 0) {
      uVar6 = 1;
      do {
        RationalNum::RationalNum((RationalNum *)&local_88,-1,1);
        RationalNum::operator*=(pRVar5 + uVar6,(RationalNum *)&local_88);
        uVar6 = uVar6 + 2;
      } while (uVar6 <= uVar8);
    }
  }
  return local_68;
}

Assistant:

Polynomial* getCharacteristicPolynomial(RationalNum** matrix, unsigned int size) {
    if(matrix == nullptr) return nullptr;

    Polynomial* polynomial = new Polynomial;
    polynomial->degree = size;
    polynomial->coefficients = new RationalNum [polynomial->degree + 1];

    for(unsigned int i = 0; i < pow(2, size); i++) {
        vector<unsigned int>rows;
        for(unsigned int j = 1, p = 0; j < pow(2, size + 1); j *= 2, p++) {
            if((i & j) != 0) rows.push_back(p);
        }
        polynomial->coefficients[size - rows.size()] += getMainMinor(matrix, rows);
    }
    for(unsigned int i = 1; i <= polynomial->degree; i += 2) polynomial->coefficients[i] *= -1ll;

    return polynomial;
}